

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> * __thiscall
rcg::Device::getStreams
          (vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
           *__return_storage_ptr__,Device *this)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  pointer pwVar1;
  pointer psVar2;
  __type _Var3;
  GC_ERROR GVar4;
  string *__lhs;
  Stream *this_00;
  GenTLException *pGVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  size_t i;
  uint32_t n;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> current;
  __shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  size_t size;
  shared_ptr<rcg::Stream> p;
  
  std::mutex::lock(&this->mtx);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->dev != (void *)0x0) {
    current.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    current.
    super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar8 = 0;
    for (uVar6 = 0;
        pwVar1 = (this->slist).
                 super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->slist).
                              super__Vector_base<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pwVar1 >> 4);
        uVar6 = uVar6 + 1) {
      std::__shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&p.super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>,
                 (long)&(pwVar1->super___weak_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar8);
      if (p.super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        push_back(&current,(value_type *)
                           &p.super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar8 = lVar8 + 0x10;
    }
    n = 0;
    GVar4 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DevGetNumDataStreams)(this->dev,&n);
    gentl = &this->gentl;
    if (GVar4 != 0) {
      pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&p,"Device::getStreams()",(allocator *)&local_160);
      GenTLException::GenTLException(pGVar5,(string *)&p,gentl);
      __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    for (uVar7 = 0; uVar7 < n; uVar7 = uVar7 + 1) {
      memset(&p,0,0x100);
      size = 0x100;
      GVar4 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DevGetDataStreamID)(this->dev,uVar7,(char *)&p,&size);
      if (GVar4 != 0) {
        pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_160,"Device::getStreams()",(allocator *)local_170);
        GenTLException::GenTLException(pGVar5,&local_160,gentl);
        __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::__cxx11::string::string((string *)&local_160,(char *)&p,(allocator *)local_170);
      lVar8 = 0;
      for (uVar6 = 0;
          uVar6 < (ulong)((long)current.
                                super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)current.
                                super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1)
      {
        __lhs = Stream::getID_abi_cxx11_
                          (*(Stream **)
                            ((long)&((current.
                                      super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr + lVar8));
        _Var3 = std::operator==(__lhs,&local_160);
        if (_Var3) goto LAB_00110628;
        lVar8 = lVar8 + 0x10;
      }
      uVar6 = 0xffffffff;
LAB_00110628:
      std::__cxx11::string::~string((string *)&local_160);
      if ((int)uVar6 < 0) {
        this_00 = (Stream *)operator_new(0x108);
        std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
                  (local_170,(__weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)this);
        Stream::Stream(this_00,(shared_ptr<rcg::Device> *)local_170,gentl,(char *)&p);
        std::__shared_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Stream,void>
                  ((__shared_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2> *)&local_160,this_00);
        std::vector<std::shared_ptr<rcg::Stream>,std::allocator<std::shared_ptr<rcg::Stream>>>::
        emplace_back<std::shared_ptr<rcg::Stream>>
                  ((vector<std::shared_ptr<rcg::Stream>,std::allocator<std::shared_ptr<rcg::Stream>>>
                    *)__return_storage_ptr__,(shared_ptr<rcg::Stream> *)&local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
      }
      else {
        std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
        push_back(__return_storage_ptr__,
                  current.
                  super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar6 & 0xffffffff));
      }
    }
    std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::clear
              (&this->slist);
    lVar8 = 0;
    for (uVar6 = 0;
        psVar2 = (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
        uVar6 = uVar6 + 1) {
      std::__weak_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<rcg::Stream,void>
                ((__weak_ptr<rcg::Stream,(__gnu_cxx::_Lock_policy)2> *)&p,
                 (__shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar2->super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar8));
      std::vector<std::weak_ptr<rcg::Stream>,std::allocator<std::weak_ptr<rcg::Stream>>>::
      emplace_back<std::weak_ptr<rcg::Stream>>
                ((vector<std::weak_ptr<rcg::Stream>,std::allocator<std::weak_ptr<rcg::Stream>>> *)
                 &this->slist,(weak_ptr<rcg::Stream> *)&p);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &p.super___shared_ptr<rcg::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      lVar8 = lVar8 + 0x10;
    }
    std::vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>::
    ~vector(&current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Stream> > Device::getStreams()
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Stream> > ret;

  if (dev != 0)
  {
    // get list of previously requested streams that are still in use

    std::vector<std::shared_ptr<Stream> > current;

    for (size_t i=0; i<slist.size(); i++)
    {
      std::shared_ptr<Stream> p=slist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // create list of streams, using either existing streams or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->DevGetNumDataStreams(dev, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::getStreams()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->DevGetDataStreamID(dev, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Device::getStreams()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Stream>(new Stream(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of streams for reusage on next call

    slist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      slist.push_back(ret[i]);
    }
  }

  return ret;

}